

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.h
# Opt level: O0

bool __thiscall data_structures::SymbolTable<int,_int>::has(SymbolTable<int,_int> *this,int *key)

{
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar1;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *local_28;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *node;
  int *key_local;
  SymbolTable<int,_int> *this_local;
  
  local_28 = LinkedList<data_structures::SymbolTableElement<int,_int>_>::begin(&this->_list);
  while( true ) {
    pLVar1 = LinkedList<data_structures::SymbolTableElement<int,_int>_>::end(&this->_list);
    if (local_28 == pLVar1) {
      return false;
    }
    if ((local_28->element).key == *key) break;
    local_28 = ListNode<data_structures::SymbolTableElement<int,_int>_>::next(local_28);
  }
  return true;
}

Assistant:

inline
    bool SymbolTable<Key, Value>::has(const Key &key){
        for (auto node = _list.begin(); node != _list.end(); node = node->next()) {
            if (node->element.key == key) {
                return true;
            }
        }
        return false;
    }